

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Own<kj::NetworkAddress> __thiscall
kj::anon_unknown_30::SocketNetwork::getSockaddr(SocketNetwork *this,void *sockaddr,uint len)

{
  _func_int **pp_Var1;
  char cVar2;
  _func_int **__dest;
  LowLevelAsyncIoProvider *pLVar3;
  uint in_ECX;
  undefined4 in_register_00000014;
  NetworkAddress *extraout_RDX;
  Own<kj::NetworkAddress> OVar4;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> array;
  Fault f;
  _func_int **local_b8;
  anon_union_128_5_6547fd28_for_addr local_b0;
  
  __dest = (_func_int **)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x88,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  SocketAddress::SocketAddress
            ((SocketAddress *)&local_b8,(void *)CONCAT44(in_register_00000014,len),in_ECX);
  memcpy(__dest,(SocketAddress *)&local_b8,0x88);
  cVar2 = (*(code *)**(undefined8 **)((long)sockaddr + 0x10))
                    ((_func_int **)((long)sockaddr + 0x10),__dest + 1,*(undefined4 *)__dest);
  if (cVar2 == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              ((Fault *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x50b,FAILED,"array[0].allowedBy(filter)","\"address blocked by restrictPeers()\"",
               (char (*) [35])"address blocked by restrictPeers()");
    kj::_::Debug::Fault::~Fault((Fault *)&local_b8);
  }
  pp_Var1 = *(_func_int ***)((long)sockaddr + 8);
  local_b0._0_8_ = 1;
  local_b0.inet4.sin_zero = (uchar  [8])&kj::_::HeapArrayDisposer::instance;
  local_b8 = __dest;
  pLVar3 = (LowLevelAsyncIoProvider *)operator_new(0x38);
  pLVar3->_vptr_LowLevelAsyncIoProvider = (_func_int **)&PTR_connect_0062c988;
  pLVar3[1]._vptr_LowLevelAsyncIoProvider = pp_Var1;
  pLVar3[2]._vptr_LowLevelAsyncIoProvider = (_func_int **)((long)sockaddr + 0x10);
  pLVar3[3]._vptr_LowLevelAsyncIoProvider = __dest;
  pLVar3[4]._vptr_LowLevelAsyncIoProvider = (_func_int **)0x1;
  pLVar3[5]._vptr_LowLevelAsyncIoProvider = (_func_int **)&kj::_::HeapArrayDisposer::instance;
  *(undefined4 *)&pLVar3[6]._vptr_LowLevelAsyncIoProvider = 0;
  (this->super_Network)._vptr_Network =
       (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressImpl>::instance;
  this->lowLevel = pLVar3;
  OVar4.ptr = extraout_RDX;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<NetworkAddress> getSockaddr(const void* sockaddr, uint len) override {
    auto array = kj::heapArrayBuilder<SocketAddress>(1);
    array.add(SocketAddress(sockaddr, len));
    KJ_REQUIRE(array[0].allowedBy(filter), "address blocked by restrictPeers()") { break; }
    return Own<NetworkAddress>(heap<NetworkAddressImpl>(lowLevel, filter, array.finish()));
  }